

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_f5ac::FlooringOnLogarithm::Run
          (FlooringOnLogarithm *this,vector<double,_std::allocator<double>_> *input_and_output)

{
  double *pdVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  
  _Var2 = std::
          __max_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    ((input_and_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                     .super__Vector_impl_data._M_start,
                     (input_and_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                     .super__Vector_impl_data._M_finish);
  dVar4 = *_Var2._M_current + this->relative_floor_;
  pdVar1 = (input_and_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (input_and_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    dVar5 = dVar4;
    if (dVar4 <= *pdVar3) {
      dVar5 = *pdVar3;
    }
    *pdVar3 = dVar5;
  }
  return true;
}

Assistant:

bool Run(std::vector<double>* input_and_output) const override {
    const double max_value(
        *std::max_element(input_and_output->begin(), input_and_output->end()));
    const double floor(max_value + relative_floor_);
    std::transform(input_and_output->begin(), input_and_output->end(),
                   input_and_output->begin(),
                   [floor](double x) { return std::max(x, floor); });
    return true;
  }